

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall Assimp::ColladaParser::ReadAnimation(ColladaParser *this,Animation *pParent)

{
  pointer *pppAVar1;
  _func_int *p_Var2;
  iterator iVar3;
  _Base_ptr p_Var4;
  size_type sVar5;
  Animation *pAVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  size_t sVar11;
  iterator iVar12;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  _Rb_tree_node_base *p_Var13;
  mapped_type *ppAVar14;
  char *pcVar15;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>,_bool>
  pVar16;
  Animation *anim;
  string animName;
  string animID;
  string id;
  ChannelMap channels;
  Animation *local_2a0;
  Animation *local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_288;
  int local_27c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_278;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_258;
  size_type local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_238;
  size_type local_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  size_type local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  vector<Assimp::Collada::Animation*,std::allocator<Assimp::Collada::Animation*>> *local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  undefined1 local_190 [16];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>
  local_180;
  key_type local_a0;
  undefined1 *local_80;
  long local_78;
  undefined1 local_70 [16];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>_>
  local_60;
  
  iVar7 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((char)iVar7 == '\0') {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_2a0 = (Animation *)0x0;
    local_1a0 = local_190;
    local_198 = (char *)0x0;
    local_190[0] = 0;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0._M_string_length = 0;
    local_a0.field_2._M_local_buf[0] = '\0';
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    iVar7 = TestAttribute(this,"name");
    iVar8 = TestAttribute(this,"id");
    local_298 = pParent;
    if (-1 < iVar8) {
      iVar9 = (*this->mReader->_vptr_IIrrXMLReader[6])();
      sVar5 = local_a0._M_string_length;
      strlen((char *)CONCAT44(extraout_var,iVar9));
      pParent = local_298;
      std::__cxx11::string::_M_replace
                ((ulong)&local_a0,0,(char *)sVar5,CONCAT44(extraout_var,iVar9));
    }
    if (iVar7 < 0) {
      if (iVar8 < 0) {
        std::__cxx11::string::_M_replace((ulong)&local_1a0,0,local_198,0x75d1b4);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&local_1a0);
      }
    }
    else {
      iVar7 = (*this->mReader->_vptr_IIrrXMLReader[6])();
      pcVar15 = local_198;
      strlen((char *)CONCAT44(extraout_var_00,iVar7));
      pParent = local_298;
      std::__cxx11::string::_M_replace((ulong)&local_1a0,0,pcVar15,CONCAT44(extraout_var_00,iVar7));
    }
    local_288 = &local_1e8;
    local_290 = &local_1c8;
    local_1a8 = &local_180.second.mInTanValues.field_2;
    local_1b0 = &local_180.second.mOutTanValues.field_2;
    local_1b8 = (vector<Assimp::Collada::Animation*,std::allocator<Assimp::Collada::Animation*>> *)
                &pParent->mSubAnims;
    local_27c = iVar8;
LAB_0041a00b:
    do {
      iVar7 = (*this->mReader->_vptr_IIrrXMLReader[2])();
      if ((char)iVar7 == '\0') goto LAB_0041a7d6;
      iVar7 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      p_Var2 = this->mReader->_vptr_IIrrXMLReader[3];
      if (iVar7 == 1) {
        iVar7 = (*p_Var2)();
        if (iVar7 == 1) {
          iVar7 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          iVar7 = strcmp((char *)CONCAT44(extraout_var_01,iVar7),"animation");
          if (iVar7 == 0) {
            if (local_2a0 == (Animation *)0x0) {
              local_2a0 = (Animation *)operator_new(0x50);
              (local_2a0->mName)._M_dataplus._M_p = (pointer)&(local_2a0->mName).field_2;
              (local_2a0->mName)._M_string_length = 0;
              (local_2a0->mName).field_2._M_local_buf[0] = '\0';
              (local_2a0->mChannels).
              super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (local_2a0->mChannels).
              super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (local_2a0->mChannels).
              super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              (local_2a0->mSubAnims).
              super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              (local_2a0->mSubAnims).
              super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              (local_2a0->mSubAnims).
              super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              std::__cxx11::string::_M_assign((string *)local_2a0);
              iVar3._M_current =
                   (pParent->mSubAnims).
                   super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
              if (iVar3._M_current ==
                  (pParent->mSubAnims).
                  super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<Assimp::Collada::Animation*,std::allocator<Assimp::Collada::Animation*>>
                ::_M_realloc_insert<Assimp::Collada::Animation*const&>(local_1b8,iVar3,&local_2a0);
              }
              else {
                *iVar3._M_current = local_2a0;
                pppAVar1 = &(pParent->mSubAnims).
                            super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                *pppAVar1 = *pppAVar1 + 1;
              }
            }
            ReadAnimation(this,local_2a0);
            goto LAB_0041a00b;
          }
          iVar7 = (*this->mReader->_vptr_IIrrXMLReader[3])();
          if (iVar7 == 1) {
            iVar7 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
            iVar7 = strcmp((char *)CONCAT44(extraout_var_02,iVar7),"source");
            if (iVar7 == 0) {
              ReadSource(this);
              goto LAB_0041a00b;
            }
            iVar7 = (*this->mReader->_vptr_IIrrXMLReader[3])();
            if (iVar7 == 1) {
              iVar7 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
              iVar7 = strcmp((char *)CONCAT44(extraout_var_03,iVar7),"sampler");
              if (iVar7 == 0) {
                uVar10 = GetAttribute(this,"id");
                iVar7 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar10);
                std::__cxx11::string::string
                          ((string *)&local_80,(char *)CONCAT44(extraout_var_05,iVar7),
                           (allocator *)&local_180);
                memset(&local_278,0,0xc0);
                local_270 = 0;
                local_268._M_local_buf[0] = '\0';
                local_258 = &local_248;
                local_250 = 0;
                local_248._M_local_buf[0] = '\0';
                local_238 = &local_228;
                local_230 = 0;
                local_228._M_local_buf[0] = '\0';
                local_218 = &local_208;
                local_210 = 0;
                local_208._M_local_buf[0] = '\0';
                local_1f8 = local_288;
                local_1f0 = 0;
                local_1e8._M_local_buf[0] = '\0';
                local_1d8 = local_290;
                local_1d0 = 0;
                local_1c8._M_local_buf[0] = '\0';
                local_180.first._M_dataplus._M_p = (pointer)&local_180.first.field_2;
                local_278 = &local_268;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_180,local_80,local_80 + local_78);
                local_180.second.mTarget._M_dataplus._M_p =
                     (pointer)&local_180.second.mTarget.field_2;
                local_180.second.mSourceTimes._M_dataplus._M_p =
                     (pointer)&local_180.second.mSourceTimes.field_2;
                if (local_278 == &local_268) {
                  local_180.second.mTarget.field_2._8_8_ = local_268._8_8_;
                }
                else {
                  local_180.second.mTarget._M_dataplus._M_p = (pointer)local_278;
                }
                local_180.second.mTarget.field_2._M_allocated_capacity._1_7_ =
                     local_268._M_allocated_capacity._1_7_;
                local_180.second.mTarget.field_2._M_local_buf[0] = local_268._M_local_buf[0];
                local_180.second.mTarget._M_string_length = local_270;
                local_270 = 0;
                local_268._M_local_buf[0] = '\0';
                if (local_258 == &local_248) {
                  local_180.second.mSourceTimes.field_2._8_8_ = local_248._8_8_;
                }
                else {
                  local_180.second.mSourceTimes._M_dataplus._M_p = (pointer)local_258;
                }
                local_180.second.mSourceTimes.field_2._M_allocated_capacity._1_7_ =
                     local_248._M_allocated_capacity._1_7_;
                local_180.second.mSourceTimes.field_2._M_local_buf[0] = local_248._M_local_buf[0];
                local_180.second.mSourceTimes._M_string_length = local_250;
                local_250 = 0;
                local_248._M_local_buf[0] = '\0';
                local_180.second.mSourceValues._M_dataplus._M_p =
                     (pointer)&local_180.second.mSourceValues.field_2;
                if (local_238 == &local_228) {
                  local_180.second.mSourceValues.field_2._8_8_ = local_228._8_8_;
                }
                else {
                  local_180.second.mSourceValues._M_dataplus._M_p = (pointer)local_238;
                }
                local_180.second.mSourceValues.field_2._M_allocated_capacity._1_7_ =
                     local_228._M_allocated_capacity._1_7_;
                local_180.second.mSourceValues.field_2._M_local_buf[0] = local_228._M_local_buf[0];
                local_180.second.mSourceValues._M_string_length = local_230;
                local_230 = 0;
                local_228._M_local_buf[0] = '\0';
                local_180.second.mInTanValues._M_dataplus._M_p = (pointer)local_1a8;
                if (local_218 == &local_208) {
                  local_1a8->_M_allocated_capacity =
                       CONCAT71(local_208._M_allocated_capacity._1_7_,local_208._M_local_buf[0]);
                  *(undefined8 *)(local_1a8->_M_local_buf + 8) = local_208._8_8_;
                }
                else {
                  local_180.second.mInTanValues._M_dataplus._M_p = (pointer)local_218;
                  local_180.second.mInTanValues.field_2._M_allocated_capacity =
                       CONCAT71(local_208._M_allocated_capacity._1_7_,local_208._M_local_buf[0]);
                }
                local_180.second.mInTanValues._M_string_length = local_210;
                local_210 = 0;
                local_208._M_local_buf[0] = '\0';
                local_180.second.mOutTanValues._M_dataplus._M_p = (pointer)local_1b0;
                if (local_1f8 == local_288) {
                  sVar5 = *(size_type *)(local_288->_M_local_buf + 8);
                  local_1b0->_M_allocated_capacity = local_288->_M_allocated_capacity;
                  *(size_type *)(local_1b0->_M_local_buf + 8) = sVar5;
                }
                else {
                  local_180.second.mOutTanValues._M_dataplus._M_p = (pointer)local_1f8;
                  local_180.second.mOutTanValues.field_2._M_allocated_capacity =
                       CONCAT71(local_1e8._M_allocated_capacity._1_7_,local_1e8._M_local_buf[0]);
                }
                local_180.second.mOutTanValues._M_string_length = local_1f0;
                local_1f8 = local_288;
                local_1f0 = 0;
                local_1e8._M_local_buf[0] = '\0';
                local_180.second.mInterpolationValues._M_dataplus._M_p =
                     (pointer)&local_180.second.mInterpolationValues.field_2;
                if (local_1d8 == local_290) {
                  local_180.second.mInterpolationValues.field_2._M_allocated_capacity =
                       local_290->_M_allocated_capacity;
                  local_180.second.mInterpolationValues.field_2._8_8_ =
                       (&local_290->_M_allocated_capacity)[1];
                }
                else {
                  local_180.second.mInterpolationValues._M_dataplus._M_p = (pointer)local_1d8;
                  local_180.second.mInterpolationValues.field_2._M_allocated_capacity =
                       CONCAT71(local_1c8._M_allocated_capacity._1_7_,local_1c8._M_local_buf[0]);
                }
                local_180.second.mInterpolationValues._M_string_length = local_1d0;
                local_1d8 = local_290;
                local_1d0 = 0;
                local_1c8._M_local_buf[0] = '\0';
                local_278 = &local_268;
                local_258 = &local_248;
                local_238 = &local_228;
                local_218 = &local_208;
                pVar16 = std::
                         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Assimp::Collada::AnimationChannel>,std::_Select1st<std::pair<std::__cxx11::string_const,Assimp::Collada::AnimationChannel>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Assimp::Collada::AnimationChannel>>>
                         ::
                         _M_emplace_unique<std::pair<std::__cxx11::string,Assimp::Collada::AnimationChannel>>
                                   ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Assimp::Collada::AnimationChannel>,std::_Select1st<std::pair<std::__cxx11::string_const,Assimp::Collada::AnimationChannel>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Assimp::Collada::AnimationChannel>>>
                                     *)&local_60,&local_180);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180.second.mInterpolationValues._M_dataplus._M_p !=
                    &local_180.second.mInterpolationValues.field_2) {
                  operator_delete(local_180.second.mInterpolationValues._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180.second.mOutTanValues._M_dataplus._M_p != local_1b0) {
                  operator_delete(local_180.second.mOutTanValues._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180.second.mInTanValues._M_dataplus._M_p != local_1a8) {
                  operator_delete(local_180.second.mInTanValues._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180.second.mSourceValues._M_dataplus._M_p !=
                    &local_180.second.mSourceValues.field_2) {
                  operator_delete(local_180.second.mSourceValues._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180.second.mSourceTimes._M_dataplus._M_p !=
                    &local_180.second.mSourceTimes.field_2) {
                  operator_delete(local_180.second.mSourceTimes._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180.second.mTarget._M_dataplus._M_p !=
                    &local_180.second.mTarget.field_2) {
                  operator_delete(local_180.second.mTarget._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_180.first._M_dataplus._M_p != &local_180.first.field_2) {
                  operator_delete(local_180.first._M_dataplus._M_p);
                }
                if (local_1d8 != local_290) {
                  operator_delete(local_1d8);
                }
                if (local_1f8 != local_288) {
                  operator_delete(local_1f8);
                }
                if (local_218 != &local_208) {
                  operator_delete(local_218);
                }
                if (local_238 != &local_228) {
                  operator_delete(local_238);
                }
                if (local_258 != &local_248) {
                  operator_delete(local_258);
                }
                if (local_278 != &local_268) {
                  operator_delete(local_278);
                }
                ReadAnimationSampler(this,(AnimationChannel *)(pVar16.first._M_node._M_node + 2));
                if (local_80 != local_70) {
                  operator_delete(local_80);
                }
                goto LAB_0041a00b;
              }
              iVar7 = (*this->mReader->_vptr_IIrrXMLReader[3])();
              if (iVar7 == 1) {
                iVar7 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
                iVar7 = strcmp((char *)CONCAT44(extraout_var_04,iVar7),"channel");
                if (iVar7 == 0) {
                  GetAttribute(this,"target");
                  uVar10 = GetAttribute(this,"source");
                  iVar7 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar10);
                  pcVar15 = (char *)CONCAT44(extraout_var_06,iVar7) +
                            (*(char *)CONCAT44(extraout_var_06,iVar7) == '#');
                  local_180.first._M_dataplus._M_p = (pointer)&local_180.first.field_2;
                  sVar11 = strlen(pcVar15);
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_180,pcVar15,pcVar15 + sVar11);
                  iVar12 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>_>
                           ::find(&local_60,&local_180.first);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_180.first._M_dataplus._M_p != &local_180.first.field_2) {
                    operator_delete(local_180.first._M_dataplus._M_p);
                  }
                  if ((_Rb_tree_header *)iVar12._M_node != &local_60._M_impl.super__Rb_tree_header)
                  {
                    iVar7 = (*this->mReader->_vptr_IIrrXMLReader[6])();
                    p_Var4 = iVar12._M_node[2]._M_parent;
                    strlen((char *)CONCAT44(extraout_var_07,iVar7));
                    pParent = local_298;
                    std::__cxx11::string::_M_replace
                              ((ulong)(iVar12._M_node + 2),0,(char *)p_Var4,
                               CONCAT44(extraout_var_07,iVar7));
                  }
                  iVar7 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
                  if ((char)iVar7 == '\0') {
                    SkipElement(this);
                  }
                }
                else {
                  SkipElement(this);
                }
                goto LAB_0041a00b;
              }
            }
          }
        }
        __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.h"
                      ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
      }
      iVar7 = (*p_Var2)();
    } while (iVar7 != 2);
    iVar7 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar7 = strcmp((char *)CONCAT44(extraout_var_08,iVar7),"animation");
    if (iVar7 != 0) {
      local_180.first._M_dataplus._M_p = (pointer)&local_180.first.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_180,"Expected end of <animation> element.","");
      ThrowException(this,&local_180.first);
    }
LAB_0041a7d6:
    if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
      if (local_2a0 == (Animation *)0x0) {
        local_2a0 = (Animation *)operator_new(0x50);
        (local_2a0->mName)._M_dataplus._M_p = (pointer)&(local_2a0->mName).field_2;
        (local_2a0->mName)._M_string_length = 0;
        (local_2a0->mName).field_2._M_local_buf[0] = '\0';
        (local_2a0->mChannels).
        super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2a0->mChannels).
        super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_2a0->mChannels).
        super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (local_2a0->mSubAnims).
        super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (local_2a0->mSubAnims).
        super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (local_2a0->mSubAnims).
        super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::_M_assign((string *)local_2a0);
        iVar3._M_current =
             (pParent->mSubAnims).
             super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (pParent->mSubAnims).
            super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Assimp::Collada::Animation*,std::allocator<Assimp::Collada::Animation*>>::
          _M_realloc_insert<Assimp::Collada::Animation*const&>(local_1b8,iVar3,&local_2a0);
        }
        else {
          *iVar3._M_current = local_2a0;
          pppAVar1 = &(pParent->mSubAnims).
                      super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppAVar1 = *pppAVar1 + 1;
        }
      }
      pAVar6 = local_2a0;
      p_Var13 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      while (local_2a0 = pAVar6,
            (_Rb_tree_header *)p_Var13 != &local_60._M_impl.super__Rb_tree_header) {
        std::
        vector<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
        ::push_back(&pAVar6->mChannels,(value_type *)(p_Var13 + 2));
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
        pAVar6 = local_2a0;
      }
      if (-1 < local_27c) {
        ppAVar14 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Animation_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Animation_*>_>_>
                   ::operator[](&this->mAnimationLibrary,&local_a0);
        *ppAVar14 = pAVar6;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
    if (local_1a0 != local_190) {
      operator_delete(local_1a0);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::AnimationChannel>_>_>
    ::~_Rb_tree(&local_60);
  }
  return;
}

Assistant:

void ColladaParser::ReadAnimation(Collada::Animation* pParent)
{
    if (mReader->isEmptyElement())
        return;

    // an <animation> element may be a container for grouping sub-elements or an animation channel
    // this is the channel collection by ID, in case it has channels
    typedef std::map<std::string, AnimationChannel> ChannelMap;
    ChannelMap channels;
    // this is the anim container in case we're a container
    Animation* anim = NULL;

    // optional name given as an attribute
    std::string animName;
    std::string animID;
    int indexName = TestAttribute("name");
    int indexID = TestAttribute("id");

    if (indexID >= 0)
        animID = mReader->getAttributeValue(indexID);

    if (indexName >= 0)
        animName = mReader->getAttributeValue(indexName);
    else if (indexID >= 0)
        animName = animID;
    else
        animName = "animation";

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            // we have subanimations
            if (IsElement("animation"))
            {
                // create container from our element
                if (!anim)
                {
                    anim = new Animation;
                    anim->mName = animName;
                    pParent->mSubAnims.push_back(anim);
                }

                // recurse into the subelement
                ReadAnimation(anim);
            }
            else if (IsElement("source"))
            {
                // possible animation data - we'll never know. Better store it
                ReadSource();
            }
            else if (IsElement("sampler"))
            {
                // read the ID to assign the corresponding collada channel afterwards.
                int indexID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(indexID);
                ChannelMap::iterator newChannel = channels.insert(std::make_pair(id, AnimationChannel())).first;

                // have it read into a channel
                ReadAnimationSampler(newChannel->second);
            }
            else if (IsElement("channel"))
            {
                // the binding element whose whole purpose is to provide the target to animate
                // Thanks, Collada! A directly posted information would have been too simple, I guess.
                // Better add another indirection to that! Can't have enough of those.
                int indexTarget = GetAttribute("target");
                int indexSource = GetAttribute("source");
                const char* sourceId = mReader->getAttributeValue(indexSource);
                if (sourceId[0] == '#')
                    sourceId++;
                ChannelMap::iterator cit = channels.find(sourceId);
                if (cit != channels.end())
                    cit->second.mTarget = mReader->getAttributeValue(indexTarget);

                if (!mReader->isEmptyElement())
                    SkipElement();
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "animation") != 0)
                ThrowException("Expected end of <animation> element.");

            break;
        }
    }

    // it turned out to have channels - add them
    if (!channels.empty())
    {
        // FIXME: Is this essentially doing the same as "single-anim-node" codepath in
        //        ColladaLoader::StoreAnimations? For now, this has been deferred to after
        //        all animations and all clips have been read. Due to handling of
        //        <library_animation_clips> this cannot be done here, as the channel owner
        //        is lost, and some exporters make up animations by referring to multiple
        //        single-channel animations from an <instance_animation>.
/*
        // special filtering for stupid exporters packing each channel into a separate animation
        if( channels.size() == 1)
        {
            pParent->mChannels.push_back( channels.begin()->second);
        } else
*/
        {
            // else create the animation, if not done yet, and store the channels
            if (!anim)
            {
                anim = new Animation;
                anim->mName = animName;
                pParent->mSubAnims.push_back(anim);
            }
            for (ChannelMap::const_iterator it = channels.begin(); it != channels.end(); ++it)
                anim->mChannels.push_back(it->second);

            if (indexID >= 0)
            {
                mAnimationLibrary[animID] = anim;
            }
        }
    }
}